

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O1

void __thiscall
presolve::HPresolve::scaleStoredRow(HPresolve *this,HighsInt row,double scale,bool integral)

{
  int iVar1;
  HighsLp *pHVar2;
  pointer pdVar3;
  pointer pdVar4;
  pointer pdVar5;
  pointer piVar6;
  pointer piVar7;
  undefined7 in_register_00000011;
  char *__name;
  ulong uVar8;
  double dVar9;
  
  pHVar2 = this->model;
  pdVar3 = (pHVar2->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar3[row] = pdVar3[row] * scale;
  pdVar4 = (pHVar2->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar4[row] = pdVar4[row] * scale;
  pdVar5 = (this->implRowDualLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar5[row] = pdVar5[row] / scale;
  pdVar5 = (this->implRowDualUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar5[row] = pdVar5[row] / scale;
  if ((int)CONCAT71(in_register_00000011,integral) != 0) {
    if (pdVar3[row] < INFINITY) {
      dVar9 = round(pdVar3[row]);
      pdVar3[row] = dVar9;
    }
    if (-INFINITY < pdVar4[row]) {
      dVar9 = round(pdVar4[row]);
      pdVar4[row] = dVar9;
    }
  }
  piVar7 = (this->rowpositions).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->rowpositions).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar7) {
    uVar8 = 0;
    do {
      __name = (char *)(long)piVar7[uVar8];
      pdVar3 = (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      dVar9 = pdVar3[(long)__name] * scale;
      pdVar3[(long)__name] = dVar9;
      if (ABS(dVar9) <= (this->options->super_HighsOptionsStruct).small_matrix_value) {
        unlink(this,__name);
      }
      uVar8 = uVar8 + 1;
      piVar7 = (this->rowpositions).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
    } while (uVar8 < (ulong)((long)(this->rowpositions).
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_finish - (long)piVar7 >> 2));
  }
  HighsLinearSumBounds::sumScaled(&this->impliedRowBounds,row,scale);
  if (scale < 0.0) {
    pdVar3 = (this->rowDualLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (this->rowDualUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    dVar9 = pdVar3[row];
    pdVar3[row] = pdVar4[row];
    pdVar4[row] = dVar9;
    pdVar3 = (this->implRowDualLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (this->implRowDualUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    dVar9 = pdVar3[row];
    pdVar3[row] = pdVar4[row];
    pdVar4[row] = dVar9;
    piVar7 = (this->rowDualLowerSource).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar6 = (this->rowDualUpperSource).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar1 = piVar7[row];
    piVar7[row] = piVar6[row];
    piVar6[row] = iVar1;
    pdVar3 = (this->model->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (this->model->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    dVar9 = pdVar3[row];
    pdVar3[row] = pdVar4[row];
    pdVar4[row] = dVar9;
  }
  return;
}

Assistant:

void HPresolve::scaleStoredRow(HighsInt row, double scale, bool integral) {
  model->row_upper_[row] *= scale;
  model->row_lower_[row] *= scale;
  implRowDualLower[row] /= scale;
  implRowDualUpper[row] /= scale;

  if (integral) {
    if (model->row_upper_[row] != kHighsInf)
      model->row_upper_[row] = std::round(model->row_upper_[row]);
    if (model->row_lower_[row] != -kHighsInf)
      model->row_lower_[row] = std::round(model->row_lower_[row]);
  }

  for (size_t j = 0; j < rowpositions.size(); ++j) {
    Avalue[rowpositions[j]] *= scale;
    if (std::abs(Avalue[rowpositions[j]]) <= options->small_matrix_value)
      unlink(rowpositions[j]);
  }

  impliedRowBounds.sumScaled(row, scale);
  if (scale < 0) {
    std::swap(rowDualLower[row], rowDualUpper[row]);
    std::swap(implRowDualLower[row], implRowDualUpper[row]);
    std::swap(rowDualLowerSource[row], rowDualUpperSource[row]);
    std::swap(model->row_lower_[row], model->row_upper_[row]);
  }
}